

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O2

DdNode * cuddHashTableLookup3(DdHashTable *hash,DdNode *f,DdNode *g,DdNode *h)

{
  ptrint *ppVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  DdHashItem **ppDVar6;
  DdNode *pDVar7;
  int iVar8;
  DdHashItem *pDVar9;
  DdHashItem *pDVar10;
  DdHashItem *pDVar11;
  
  iVar3 = *(int *)(((ulong)g & 0xfffffffffffffffe) + 0x20);
  iVar4 = *(int *)(((ulong)f & 0xfffffffffffffffe) + 0x20);
  iVar5 = *(int *)(((ulong)h & 0xfffffffffffffffe) + 0x20);
  iVar8 = hash->shift;
  ppDVar6 = hash->bucket;
  pDVar10 = (DdHashItem *)(DdHashItem **)0x0;
  pDVar11 = (DdHashItem *)
            (ppDVar6 +
            ((((uint)h & 1) + iVar5 * 2 +
             (((uint)f & 1) + iVar4 * 2 + ((uint)g & 1) + iVar3 * 2) * 0xc00005) * 0x40f1f9 >>
            ((byte)iVar8 & 0x1f)));
  do {
    pDVar9 = pDVar10;
    pDVar11 = pDVar11->next;
    if (pDVar11 == (DdHashItem *)0x0) {
      return (DdNode *)0x0;
    }
    pDVar10 = pDVar11;
  } while (((pDVar11->key[0] != f) || ((DdNode *)pDVar11[1].next != g)) ||
          ((DdNode *)pDVar11[1].count != h));
  pDVar7 = pDVar11->value;
  ppVar1 = &pDVar11->count;
  *ppVar1 = *ppVar1 + -1;
  if (*ppVar1 != 0) {
    return pDVar7;
  }
  piVar2 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
  *piVar2 = *piVar2 + -1;
  pDVar10 = (DdHashItem *)
            (ppDVar6 +
            ((((uint)h & 1) + iVar5 * 2 +
             (((uint)f & 1) + iVar4 * 2 + ((uint)g & 1) + iVar3 * 2) * 0xc00005) * 0x40f1f9 >>
            ((byte)iVar8 & 0x1f)));
  if (pDVar9 != (DdHashItem *)0x0) {
    pDVar10 = pDVar9;
  }
  pDVar10->next = pDVar11->next;
  pDVar11->next = hash->nextFree;
  hash->nextFree = pDVar11;
  hash->size = hash->size - 1;
  return pDVar7;
}

Assistant:

DdNode *
cuddHashTableLookup3(
  DdHashTable * hash,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    unsigned int posn;
    DdHashItem *item, *prev;

#ifdef DD_DEBUG
    assert(hash->keysize == 3);
#endif

    posn = ddLCHash3(cuddF2L(f),cuddF2L(g),cuddF2L(h),hash->shift);
    item = hash->bucket[posn];
    prev = NULL;

    while (item != NULL) {
        DdNodePtr *key = item->key;
        if ((f == key[0]) && (g == key[1]) && (h == key[2])) {
            DdNode *value = item->value;
            cuddSatDec(item->count);
            if (item->count == 0) {
                cuddDeref(value);
                if (prev == NULL) {
                    hash->bucket[posn] = item->next;
                } else {
                    prev->next = item->next;
                }
                item->next = hash->nextFree;
                hash->nextFree = item;
                hash->size--;
            }
            return(value);
        }
        prev = item;
        item = item->next;
    }
    return(NULL);

}